

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O3

Aig_Man_t *
Ssw_SignalCorrespondenceWithPairs
          (Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vIds1,Vec_Int_t *vIds2,Ssw_Pars_t *pPars)

{
  Aig_Man_t *p;
  Vec_Int_t *vPairs;
  Vec_Int_t **pvClasses;
  Ssw_Man_t *p_00;
  Ssw_Cla_t *pSVar1;
  Ssw_Sml_t *pManData;
  Aig_Man_t *pAVar2;
  Ssw_Pars_t Pars;
  Ssw_Pars_t SStack_d8;
  
  if (vIds1->nSize == vIds2->nSize) {
    p = Saig_ManCreateMiter(pAig1,pAig2,0);
    pAVar2 = p;
    Aig_ManCleanup(p);
    vPairs = Ssw_TransferSignalPairs(pAVar2,pAig1,pAig2,vIds1,vIds2);
    pvClasses = Ssw_TransformPairsIntoTempClasses(vPairs,p->vObjs->nSize);
    if (vPairs->pArray != (int *)0x0) {
      free(vPairs->pArray);
    }
    free(vPairs);
    if (pPars == (Ssw_Pars_t *)0x0) {
      Ssw_ManSetDefaultParams(&SStack_d8);
      pPars = &SStack_d8;
    }
    p_00 = Ssw_ManCreate(p,pPars);
    pSVar1 = Ssw_ClassesPreparePairs(p,pvClasses);
    p_00->ppClasses = pSVar1;
    pManData = Ssw_SmlStart(p,0,p_00->pPars->nFramesAddSim + p_00->nFrames,1);
    p_00->pSml = pManData;
    Ssw_ClassesSetData(p_00->ppClasses,pManData,Ssw_SmlObjHashWord,Ssw_SmlObjIsConstWord,
                       Ssw_SmlObjsAreEqualWord);
    pAVar2 = Ssw_SignalCorrespondenceRefine(p_00);
    Ssw_FreeTempClasses(pvClasses,p->vObjs->nSize);
    Ssw_ManStop(p_00);
    Aig_ManStop(p);
    return pAVar2;
  }
  __assert_fail("Vec_IntSize(vIds1) == Vec_IntSize(vIds2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                ,0x117,
                "Aig_Man_t *Ssw_SignalCorrespondenceWithPairs(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Ssw_Pars_t *)"
               );
}

Assistant:

Aig_Man_t * Ssw_SignalCorrespondenceWithPairs( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vIds1, Vec_Int_t * vIds2, Ssw_Pars_t * pPars )
{
    Ssw_Man_t * p;
    Aig_Man_t * pAigNew, * pMiter;
    Ssw_Pars_t Pars;
    Vec_Int_t * vPairs;
    Vec_Int_t ** pvClasses;
    assert( Vec_IntSize(vIds1) == Vec_IntSize(vIds2) );
    // create sequential miter
    pMiter = Saig_ManCreateMiter( pAig1, pAig2, 0 );
    Aig_ManCleanup( pMiter );
    // transfer information to the miter
    vPairs = Ssw_TransferSignalPairs( pMiter, pAig1, pAig2, vIds1, vIds2 );
    // create representation of the classes
    pvClasses = Ssw_TransformPairsIntoTempClasses( vPairs, Aig_ManObjNumMax(pMiter) );
    Vec_IntFree( vPairs );
    // if parameters are not given, create them
    if ( pPars == NULL )
        Ssw_ManSetDefaultParams( pPars = &Pars );
    // start the induction manager
    p = Ssw_ManCreate( pMiter, pPars );
    // create equivalence classes using these IDs
    p->ppClasses = Ssw_ClassesPreparePairs( pMiter, pvClasses );
    p->pSml = Ssw_SmlStart( pMiter, 0, p->nFrames + p->pPars->nFramesAddSim, 1 );
    Ssw_ClassesSetData( p->ppClasses, p->pSml, (unsigned(*)(void *,Aig_Obj_t *))Ssw_SmlObjHashWord, (int(*)(void *,Aig_Obj_t *))Ssw_SmlObjIsConstWord, (int(*)(void *,Aig_Obj_t *,Aig_Obj_t *))Ssw_SmlObjsAreEqualWord );
    // perform refinement of classes
    pAigNew = Ssw_SignalCorrespondenceRefine( p );
    // cleanup
    Ssw_FreeTempClasses( pvClasses, Aig_ManObjNumMax(pMiter) );
    Ssw_ManStop( p );
    Aig_ManStop( pMiter );
    return pAigNew;
}